

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_switch.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  Color in_ECX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  enable_if_t<is_constructible_v<decay_t<const_char_(&)[5]>,_const_char_(&)[5]>,_optional<decay_t<const_char_(&)[5]>_>_>
  eVar5;
  _Storage<const_char_*,_true> local_178;
  undefined1 local_170;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  _Storage<const_char_*,_true> local_140;
  undefined1 local_138;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  _Storage<const_char_*,_true> local_108;
  undefined1 local_100;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  magic_enum local_ca;
  allocator<char> local_c9;
  string local_c8 [6];
  overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_example_example_switch_cpp:93:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_example_example_switch_cpp:96:5)>
  switcher3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> empty;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  magic_enum local_15 [3];
  overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_example_example_switch_cpp:60:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_example_example_switch_cpp:63:5)>
  local_12;
  anon_class_1_0_00000001 local_11;
  undefined4 uStack_10;
  overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_example_example_switch_cpp:74:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_example_example_switch_cpp:77:5)>
  switcher2;
  overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_example_example_switch_cpp:60:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_example_example_switch_cpp:63:5)>
  switcher1;
  anon_class_1_0_00000001 lambda;
  Color c;
  
  uStack_10 = 0;
  magic_enum::
  enum_switch<magic_enum::detail::default_result_type,Color,(magic_enum::detail::enum_subtype)0,main::__0&,void>
            (&local_11,RED);
  uStack_10 = 2;
  magic_enum::
  enum_switch<magic_enum::detail::default_result_type,Color,(magic_enum::detail::enum_subtype)0,main::__0&,void>
            (&local_11,GREEN);
  magic_enum::
  enum_switch<magic_enum::detail::default_result_type,Color,(magic_enum::detail::enum_subtype)0,overloaded<main::__1,main::__2>&,void>
            (&local_12,GREEN);
  magic_enum::
  enum_switch<magic_enum::detail::default_result_type,Color,(magic_enum::detail::enum_subtype)0,overloaded<main::__1,main::__2>&,void>
            (&local_12,BLUE);
  magic_enum::
  enum_switch<magic_enum::detail::default_result_type,Color,(magic_enum::detail::enum_subtype)0,overloaded<main::__1,main::__2>&,void>
            (&local_12,RED);
  magic_enum::
  enum_switch<std::__cxx11::string,Color,(magic_enum::detail::enum_subtype)0,overloaded<main::__3,main::__4>&,std::__cxx11::string>
            (&local_38,local_15,
             (overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_example_example_switch_cpp:74:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_example_example_switch_cpp:77:5)>
              *)0x2,in_ECX);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_38);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_38);
  magic_enum::
  enum_switch<std::__cxx11::string,Color,(magic_enum::detail::enum_subtype)0,overloaded<main::__3,main::__4>&,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (empty.field_2._M_local_buf + 8),local_15,
             (overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_example_example_switch_cpp:74:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_example_example_switch_cpp:77:5)>
              *)0x0,in_ECX);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)(empty.field_2._M_local_buf + 8));
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)(empty.field_2._M_local_buf + 8));
  magic_enum::
  enum_switch<std::__cxx11::string,Color,(magic_enum::detail::enum_subtype)0,overloaded<main::__3,main::__4>&,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,local_15,
             (overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_example_example_switch_cpp:74:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_example_example_switch_cpp:77:5)>
              *)0xfffffffd,in_ECX);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    __assert_fail("empty.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]magic_enum/example/example_switch.cpp"
                  ,0x57,"int main()");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c8,"unrecognized",&local_c9);
  magic_enum::
  enum_switch<std::__cxx11::string,Color,(magic_enum::detail::enum_subtype)0,overloaded<main::__3,main::__4>&,std::__cxx11::string>
            (&local_a8,local_15,
             (overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_example_example_switch_cpp:74:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_example_example_switch_cpp:77:5)>
              *)0xfffffffd,(Color)local_c8,in_R8);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_a8);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::ostream::operator<<((ostream *)&std::cout,std::boolalpha);
  eVar5 = std::make_optional<char_const(&)[5]>((char (*) [5])"cica");
  local_108 = eVar5.super__Optional_base<const_char_*,_true,_true>._M_payload.
              super__Optional_payload_base<const_char_*>._M_payload;
  local_100 = eVar5.super__Optional_base<const_char_*,_true,_true>._M_payload.
              super__Optional_payload_base<const_char_*>._M_engaged;
  magic_enum::
  enum_switch<std::optional<char_const*>,Color,(magic_enum::detail::enum_subtype)0,overloaded<main::__5,main::__6>&,std::optional<std::__cxx11::string>>
            (&local_f8,&local_ca,
             (overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_example_example_switch_cpp:93:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_example_example_switch_cpp:96:5)>
              *)0x2,(Color)&local_108,(optional<const_char_*> *)in_R8);
  pbVar4 = std::
           optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::value(&local_f8);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)pbVar4);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_f8);
  eVar5 = std::make_optional<char_const(&)[5]>((char (*) [5])"cica");
  local_140 = eVar5.super__Optional_base<const_char_*,_true,_true>._M_payload.
              super__Optional_payload_base<const_char_*>._M_payload;
  local_138 = eVar5.super__Optional_base<const_char_*,_true,_true>._M_payload.
              super__Optional_payload_base<const_char_*>._M_engaged;
  magic_enum::
  enum_switch<std::optional<char_const*>,Color,(magic_enum::detail::enum_subtype)0,overloaded<main::__5,main::__6>&,std::optional<std::__cxx11::string>>
            (&local_130,&local_ca,
             (overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_example_example_switch_cpp:93:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_example_example_switch_cpp:96:5)>
              *)0x0,(Color)&local_140,(optional<const_char_*> *)in_R8);
  pbVar4 = std::
           optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::value(&local_130);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)pbVar4);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_130);
  eVar5 = std::make_optional<char_const(&)[5]>((char (*) [5])"cica");
  local_178 = eVar5.super__Optional_base<const_char_*,_true,_true>._M_payload.
              super__Optional_payload_base<const_char_*>._M_payload;
  local_170 = eVar5.super__Optional_base<const_char_*,_true,_true>._M_payload.
              super__Optional_payload_base<const_char_*>._M_engaged;
  magic_enum::
  enum_switch<std::optional<char_const*>,Color,(magic_enum::detail::enum_subtype)0,overloaded<main::__5,main::__6>&,std::optional<std::__cxx11::string>>
            (&local_168,&local_ca,
             (overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_example_example_switch_cpp:93:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_example_example_switch_cpp:96:5)>
              *)0x1,(Color)&local_178,(optional<const_char_*> *)in_R8);
  bVar1 = std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::has_value(&local_168);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,bVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_168);
  std::__cxx11::string::~string((string *)local_88);
  return 0;
}

Assistant:

int main() {
  Color c = Color::RED;

  auto lambda = [] (auto value) {
    std::cout << DoWork<value>() << std::endl;
  };

  magic_enum::enum_switch(lambda, c); // prints "default"

  c = Color::GREEN;

  magic_enum::enum_switch(lambda, c); // prints "override"

  // with object, explicit enum type
  auto switcher1 = overloaded{
    [] (magic_enum::enum_constant<Color::BLUE>) {
      std::cout << "Blue" << std::endl;
    },
    [] (magic_enum::enum_constant<Color::RED>) {
      std::cout << "Red" << std::endl;
    }
  };

  magic_enum::enum_switch(switcher1, Color::GREEN); // prints nothing
  magic_enum::enum_switch(switcher1, Color::BLUE); // prints "Blue"
  magic_enum::enum_switch(switcher1, Color::RED); // prints "Red"

  // explicit result type
  auto switcher2 = overloaded{
    [] (magic_enum::enum_constant<Color::GREEN>) {
      return "called with green argument";
    },
    [] (Color other) { // default case
      auto name = magic_enum::enum_name(other); // not empty
      return "default: " + std::string{name};
    }
  };

  std::cout << magic_enum::enum_switch<std::string>(switcher2, Color::GREEN) << std::endl; // prints "called with green argument"
  std::cout << magic_enum::enum_switch<std::string>(switcher2, Color::RED) << std::endl; // prints "default: RED"

  auto empty = magic_enum::enum_switch<std::string>(switcher2, static_cast<Color>(-3)); // returns an empty string
  assert(empty.empty());

  // result with default object
  std::cout << magic_enum::enum_switch<std::string>(switcher2, static_cast<Color>(-3), "unrecognized") << std::endl; // prints "unrecognized"

  auto switcher3 = overloaded{
    [] (magic_enum::enum_constant<Color::RED>) -> std::optional<std::string> {
      return "red result";
    },
    [] (magic_enum::enum_constant<Color::BLUE>) -> std::optional<std::string> {
      return std::nullopt;
    }
  };

  std::cout << std::boolalpha;
  std::cout << magic_enum::enum_switch(switcher3, Color::GREEN, std::make_optional("cica")).value() << std::endl; // prints default: "cica"
  std::cout << magic_enum::enum_switch(switcher3, Color::RED, std::make_optional("cica")).value() << std::endl; // prints: "red result"
  std::cout << magic_enum::enum_switch(switcher3, Color::BLUE, std::make_optional("cica")).has_value() << std::endl; // prints: false

  return 0;
}